

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mime.h
# Opt level: O0

string * MimeTypes::get(string *__return_storage_ptr__,string *ext)

{
  __type _Var1;
  allocator<char> local_1d;
  int local_1c;
  string *psStack_18;
  int i;
  string *ext_local;
  
  local_1c = 0;
  psStack_18 = ext;
  ext_local = __return_storage_ptr__;
  while( true ) {
    if (0x156 < local_1c) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_1d);
      std::allocator<char>::~allocator(&local_1d);
      return __return_storage_ptr__;
    }
    _Var1 = std::operator==(ext,&mimeType[local_1c].extension);
    if (_Var1) break;
    local_1c = local_1c + 1;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,&mimeType[local_1c].mime);
  return __return_storage_ptr__;
}

Assistant:

static std::string get(std::string ext)
    {
        for (int i = 0; i < MIME_SIZE; i++) {
            if (ext == MimeTypes::mimeType[i].extension) return MimeTypes::mimeType[i].mime;
        }
        return "";
    }